

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

void __thiscall DataRefs::SetChannelEnabled(DataRefs *this,dataRefsLT ch,bool bEnable)

{
  bool bVar1;
  undefined7 in_register_00000011;
  
  *(int *)((long)this->cmdXP + (long)(int)ch * 4 + 0xd8) =
       (int)CONCAT71(in_register_00000011,bEnable);
  if (this->bChannel[7] != 0) {
    this->bChannel[8] = 1;
    this->bChannel[9] = 1;
  }
  if ((!bEnable) && (this->bShowingAircraft != 0)) {
    bVar1 = LTFlightDataAnyTrackingChEnabled();
    if (!bVar1) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x9b6,"SetChannelEnabled",logERR,anon_var_dwarf_c6b84 + 4);
      }
      CreateMsgWindow(12.0,logERR,anon_var_dwarf_c6b84 + 4);
      return;
    }
  }
  return;
}

Assistant:

void DataRefs::SetChannelEnabled (dataRefsLT ch, bool bEnable)
{
    bChannel[ch - DR_CHANNEL_FIRST] = bEnable;
    
    // If OpenSky Tracking is enabled then make sure OpenSky Master is also
    if (IsChannelEnabled(DR_CHANNEL_OPEN_SKY_ONLINE)) {
        bChannel[DR_CHANNEL_OPEN_SKY_AC_MASTERDATA - DR_CHANNEL_FIRST] = true;
        bChannel[DR_CHANNEL_OPEN_SKY_AC_MASTERFILE - DR_CHANNEL_FIRST] = true;
    }
    
    // if a channel got disabled check if any tracking data channel is left
    if (!bEnable && AreAircraftDisplayed() &&   // something just got disabled? And A/C are currently displayed?
        !LTFlightDataAnyTrackingChEnabled())    // but no tracking data channel left active?
    {
        SHOW_MSG(logERR, ERR_CH_NONE_ACTIVE);
    }
}